

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

String * __thiscall
Rml::StringUtilities::StripWhitespace_abi_cxx11_
          (String *__return_storage_ptr__,StringUtilities *this,StringView string)

{
  char *__end;
  char *__beg;
  bool local_5a;
  bool local_59;
  allocator<char> local_31;
  char *local_30;
  char *end;
  char *start;
  StringView string_local;
  
  string_local.p_begin = string.p_begin;
  start = (char *)this;
  string_local.p_end = (char *)__return_storage_ptr__;
  end = StringView::begin((StringView *)&start);
  local_30 = StringView::end((StringView *)&start);
  while( true ) {
    local_59 = false;
    if (end < local_30) {
      local_59 = IsWhitespace(*end);
    }
    if (local_59 == false) break;
    end = end + 1;
  }
  while( true ) {
    local_5a = false;
    if (end < local_30) {
      local_5a = IsWhitespace(local_30[-1]);
    }
    __beg = end;
    __end = local_30;
    if (local_5a == false) break;
    local_30 = local_30 + -1;
  }
  if (end < local_30) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,__beg,__end,&local_31);
    ::std::allocator<char>::~allocator(&local_31);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

RMLUICORE_API String StringUtilities::StripWhitespace(StringView string)
{
	const char* start = string.begin();
	const char* end = string.end();

	while (start < end && IsWhitespace(*start))
		start++;

	while (end > start && IsWhitespace(*(end - 1)))
		end--;

	if (start < end)
		return String(start, end);

	return String();
}